

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_fast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *iEnd;
  BYTE *pBVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ZSTD_longLengthType_e ZVar7;
  ZSTD_matchState_t *pZVar8;
  BYTE *pBVar9;
  ulong *mEnd;
  BYTE *pBVar10;
  U32 *pUVar11;
  U32 *pUVar12;
  bool bVar13;
  undefined8 uVar14;
  char cVar15;
  long lVar16;
  ulong uVar17;
  size_t sVar18;
  BYTE *pBVar19;
  byte bVar20;
  byte bVar21;
  BYTE *iStart;
  ulong uVar22;
  ulong *puVar23;
  ulong *puVar24;
  BYTE *litEnd;
  ulong *puVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  ulong *puVar29;
  ulong uVar30;
  int *piVar31;
  long lVar32;
  uint uVar33;
  ulong uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  ulong uVar38;
  uint uVar39;
  ulong uVar40;
  int iVar41;
  uint uVar42;
  uint uVar43;
  ulong uVar44;
  seqDef *psVar45;
  U32 UVar46;
  ulong uVar47;
  ulong *puVar48;
  int iVar49;
  BYTE *pBVar50;
  ulong *puVar51;
  ulong *puVar52;
  BYTE *iend;
  U32 prefixStartIndex;
  U32 dictIndexDelta;
  BYTE *ilimit;
  BYTE *litLimit_w;
  BYTE *prefixStart;
  BYTE *dictBase;
  BYTE *litLimit_w_6;
  BYTE *litLimit_w_4;
  BYTE *dictEnd;
  BYTE *base;
  U32 *hashTable;
  char *_ptr;
  BYTE *dictStart;
  U32 dictStartIndex;
  uint local_130;
  
  pZVar8 = ms->dictMatchState;
  if (pZVar8 == (ZSTD_matchState_t *)0x0) {
    __assert_fail("ms->dictMatchState != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x724e,
                  "size_t ZSTD_compressBlock_fast_dictMatchState(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  uVar43 = (ms->cParams).targetLength;
  uVar47 = (ulong)(uVar43 + (uVar43 == 0));
  pBVar9 = (ms->window).base;
  uVar4 = (ms->window).dictLimit;
  iStart = pBVar9 + uVar4;
  iEnd = (ulong *)((long)src + srcSize);
  puVar29 = (ulong *)((long)src + (srcSize - 8));
  uVar5 = (pZVar8->window).dictLimit;
  mEnd = (ulong *)(pZVar8->window).nextSrc;
  pBVar10 = (pZVar8->window).base;
  pBVar50 = pBVar10 + uVar5;
  uVar33 = (int)mEnd - (int)pBVar10;
  uVar26 = uVar4 - uVar33;
  iVar27 = ((int)src - (int)iStart) + (int)mEnd;
  iVar49 = (int)pBVar50;
  uVar28 = iVar27 - iVar49;
  uVar35 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  pUVar11 = pZVar8->hashTable;
  uVar42 = (pZVar8->cParams).hashLog;
  iVar41 = (int)pBVar9;
  uVar36 = ((int)iEnd - iVar41) - uVar4;
  uVar39 = (ms->cParams).minMatch;
  pUVar12 = ms->hashTable;
  uVar6 = (ms->cParams).hashLog;
  uVar37 = *rep;
  local_130 = rep[1];
  uVar43 = uVar42 + 8;
  bVar20 = (byte)uVar42;
  cVar15 = (char)uVar6;
  puVar52 = (ulong *)src;
  if (uVar39 == 5) {
    if (uVar35 < uVar36) goto LAB_0016ebb0;
    if (uVar4 < uVar33) goto LAB_0016ebcf;
    if ((ms->prefetchCDictTables != 0) && (uVar42 < 0x3e)) {
      uVar34 = 0;
      do {
        uVar34 = uVar34 + 0x40;
      } while (uVar34 < (ulong)(4L << (bVar20 & 0x3f)));
    }
    if (uVar28 < uVar37) goto LAB_0016ebee;
    if (uVar28 < local_130) goto LAB_0016ec0d;
    puVar48 = (ulong *)((long)src + uVar47);
    if (puVar48 <= puVar29) {
      if ((uVar6 < 0x21) && (uVar43 < 0x21)) {
        bVar21 = 0x40 - cVar15;
        puVar1 = iEnd + -4;
        puVar25 = (ulong *)((long)src + (ulong)(iVar27 == iVar49));
LAB_0016d5f1:
        uVar22 = *puVar25 * -0x30e4432345000000;
        uVar40 = uVar22 >> (0x38 - bVar20 & 0x3f);
        uVar44 = (ulong)pUVar11[uVar40 >> 8];
        uVar40 = uVar40 ^ uVar44;
        puVar23 = puVar25 + 0x20;
        uVar34 = uVar47;
LAB_0016d62e:
        puVar24 = puVar48;
        uVar30 = uVar22 >> (bVar21 & 0x3f);
        uVar43 = pUVar12[uVar30];
        uVar17 = (ulong)uVar43;
        UVar46 = (U32)((long)puVar25 - (long)pBVar9);
        uVar42 = (UVar46 - uVar37) + 1;
        uVar22 = *puVar24 * -0x30e4432345000000;
        uVar38 = uVar22 >> (0x38 - bVar20 & 0x3f);
        pUVar12[uVar30] = UVar46;
        if ((uVar4 - 1) - uVar42 < 3) {
LAB_0016d6b0:
          puVar48 = puVar25;
          if ((char)uVar40 == '\0') {
            uVar40 = uVar44 >> 8;
            uVar42 = (uint)(uVar44 >> 8);
            if (((uVar5 < uVar42) && (*(int *)(pBVar10 + uVar40) == (int)*puVar25)) &&
               (uVar43 <= uVar4)) {
              sVar18 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar25 + 4),pBVar10 + uVar40 + 4,(BYTE *)iEnd,
                                  (BYTE *)mEnd,iStart);
              uVar34 = sVar18 + 4;
              if (puVar25 <= puVar52) goto LAB_0016dc18;
              pBVar19 = pBVar10 + (uVar40 - 1);
              goto LAB_0016d95c;
            }
          }
          if ((uVar4 < uVar43) && (piVar31 = (int *)(pBVar9 + uVar17), *piVar31 == (int)*puVar25))
          goto LAB_0016d817;
          uVar34 = (uVar34 + 1) - (ulong)(puVar24 < puVar23);
          if (puVar29 < (ulong *)((long)puVar24 + uVar34)) goto LAB_0016eab3;
          puVar23 = puVar23 + (ulong)(puVar23 <= puVar24) * 0x20;
          uVar44 = (ulong)pUVar11[uVar38 >> 8];
          uVar40 = uVar38 ^ uVar44;
          puVar48 = (ulong *)((long)puVar24 + uVar34);
          puVar25 = puVar24;
          goto LAB_0016d62e;
        }
        piVar31 = (int *)(pBVar9 + uVar42);
        if (uVar42 < uVar4) {
          piVar31 = (int *)(pBVar10 + (uVar42 - uVar26));
        }
        if (*piVar31 != *(int *)((long)puVar25 + 1)) goto LAB_0016d6b0;
        puVar48 = iEnd;
        if (uVar42 < uVar4) {
          puVar48 = mEnd;
        }
        sVar18 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar25 + 5),(BYTE *)(piVar31 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar48,iStart);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_0016ead7;
        if (0x20000 < seqStore->maxNbLit) goto LAB_0016eaf6;
        puVar48 = (ulong *)((long)puVar25 + 1);
        uVar22 = (long)puVar48 - (long)puVar52;
        puVar23 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar23 + uVar22))
        goto LAB_0016eb53;
        if (iEnd < puVar48) goto LAB_0016eb34;
        if (puVar1 < puVar48) {
          ZSTD_safecopyLiterals((BYTE *)puVar23,(BYTE *)puVar52,(BYTE *)puVar48,(BYTE *)puVar1);
          goto LAB_0016d7df;
        }
        uVar34 = puVar52[1];
        *puVar23 = *puVar52;
        puVar23[1] = uVar34;
        pBVar19 = seqStore->lit;
        if (uVar22 < 0x11) {
          seqStore->lit = pBVar19 + uVar22;
          goto LAB_0016d990;
        }
        if (0xffffffffffffffe0 < (ulong)((long)(pBVar19 + 0x10) + (-0x10 - (long)(puVar52 + 2))))
        goto LAB_0016eca8;
        uVar34 = puVar52[3];
        *(ulong *)(pBVar19 + 0x10) = puVar52[2];
        *(ulong *)(pBVar19 + 0x18) = uVar34;
        if (0x20 < (long)uVar22) {
          lVar32 = 0;
          do {
            puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x20);
            uVar14 = puVar3[1];
            pBVar2 = pBVar19 + lVar32 + 0x20;
            *(undefined8 *)pBVar2 = *puVar3;
            *(undefined8 *)(pBVar2 + 8) = uVar14;
            puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x30);
            uVar14 = puVar3[1];
            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
            *(undefined8 *)(pBVar2 + 0x18) = uVar14;
            lVar32 = lVar32 + 0x20;
          } while (pBVar2 + 0x20 < pBVar19 + uVar22);
        }
LAB_0016d7df:
        seqStore->lit = seqStore->lit + uVar22;
        if (0xffff < uVar22) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0016ec89;
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
LAB_0016d990:
        uVar34 = sVar18 + 4;
        psVar45 = seqStore->sequences;
        psVar45->litLength = (U16)uVar22;
        psVar45->offBase = 1;
        if (2 < uVar34) {
          uVar22 = sVar18 + 1;
          uVar43 = uVar37;
          if (uVar22 < 0x10000) goto LAB_0016dda7;
          if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_0016dd8e;
          goto LAB_0016eb72;
        }
        goto LAB_0016eb15;
      }
      goto LAB_0016ec2c;
    }
  }
  else if (uVar39 == 6) {
    if (uVar35 < uVar36) goto LAB_0016ebb0;
    if (uVar4 < uVar33) goto LAB_0016ebcf;
    if ((ms->prefetchCDictTables != 0) && (uVar42 < 0x3e)) {
      uVar34 = 0;
      do {
        uVar34 = uVar34 + 0x40;
      } while (uVar34 < (ulong)(4L << (bVar20 & 0x3f)));
    }
    if (uVar28 < uVar37) goto LAB_0016ebee;
    if (uVar28 < local_130) goto LAB_0016ec0d;
    puVar48 = (ulong *)((long)src + uVar47);
    if (puVar48 <= puVar29) {
      if ((uVar6 < 0x21) && (uVar43 < 0x21)) {
        bVar21 = 0x40 - cVar15;
        puVar1 = iEnd + -4;
        puVar25 = (ulong *)((long)src + (ulong)(iVar27 == iVar49));
LAB_0016caea:
        uVar22 = *puVar25 * -0x30e4432340650000;
        uVar40 = uVar22 >> (0x38 - bVar20 & 0x3f);
        uVar44 = (ulong)pUVar11[uVar40 >> 8];
        uVar40 = uVar40 ^ uVar44;
        puVar23 = puVar25 + 0x20;
        uVar34 = uVar47;
LAB_0016cb27:
        puVar24 = puVar48;
        uVar30 = uVar22 >> (bVar21 & 0x3f);
        uVar43 = pUVar12[uVar30];
        uVar17 = (ulong)uVar43;
        UVar46 = (U32)((long)puVar25 - (long)pBVar9);
        uVar42 = (UVar46 - uVar37) + 1;
        uVar22 = *puVar24 * -0x30e4432340650000;
        uVar38 = uVar22 >> (0x38 - bVar20 & 0x3f);
        pUVar12[uVar30] = UVar46;
        if ((uVar4 - 1) - uVar42 < 3) {
LAB_0016cba4:
          puVar48 = puVar25;
          if ((char)uVar40 == '\0') {
            uVar40 = uVar44 >> 8;
            uVar42 = (uint)(uVar44 >> 8);
            if (((uVar5 < uVar42) && (*(int *)(pBVar10 + uVar40) == (int)*puVar25)) &&
               (uVar43 <= uVar4)) {
              sVar18 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar25 + 4),pBVar10 + uVar40 + 4,(BYTE *)iEnd,
                                  (BYTE *)mEnd,iStart);
              uVar34 = sVar18 + 4;
              if (puVar25 <= puVar52) goto LAB_0016d106;
              pBVar19 = pBVar10 + (uVar40 - 1);
              goto LAB_0016ce4d;
            }
          }
          if ((uVar4 < uVar43) && (piVar31 = (int *)(pBVar9 + uVar17), *piVar31 == (int)*puVar25))
          goto LAB_0016cd08;
          uVar34 = (uVar34 + 1) - (ulong)(puVar24 < puVar23);
          if (puVar29 < (ulong *)((long)puVar24 + uVar34)) goto LAB_0016eab3;
          puVar23 = puVar23 + (ulong)(puVar23 <= puVar24) * 0x20;
          uVar44 = (ulong)pUVar11[uVar38 >> 8];
          uVar40 = uVar38 ^ uVar44;
          puVar48 = (ulong *)((long)puVar24 + uVar34);
          puVar25 = puVar24;
          goto LAB_0016cb27;
        }
        piVar31 = (int *)(pBVar9 + uVar42);
        if (uVar42 < uVar4) {
          piVar31 = (int *)(pBVar10 + (uVar42 - uVar26));
        }
        if (*piVar31 != *(int *)((long)puVar25 + 1)) goto LAB_0016cba4;
        puVar48 = iEnd;
        if (uVar42 < uVar4) {
          puVar48 = mEnd;
        }
        sVar18 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar25 + 5),(BYTE *)(piVar31 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar48,iStart);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_0016ead7;
        if (0x20000 < seqStore->maxNbLit) goto LAB_0016eaf6;
        puVar48 = (ulong *)((long)puVar25 + 1);
        uVar22 = (long)puVar48 - (long)puVar52;
        puVar23 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar23 + uVar22))
        goto LAB_0016eb53;
        if (iEnd < puVar48) goto LAB_0016eb34;
        if (puVar1 < puVar48) {
          ZSTD_safecopyLiterals((BYTE *)puVar23,(BYTE *)puVar52,(BYTE *)puVar48,(BYTE *)puVar1);
          goto LAB_0016ccd0;
        }
        uVar34 = puVar52[1];
        *puVar23 = *puVar52;
        puVar23[1] = uVar34;
        pBVar19 = seqStore->lit;
        if (uVar22 < 0x11) {
          seqStore->lit = pBVar19 + uVar22;
          goto LAB_0016ce81;
        }
        if (0xffffffffffffffe0 < (ulong)((long)(pBVar19 + 0x10) + (-0x10 - (long)(puVar52 + 2))))
        goto LAB_0016eca8;
        uVar34 = puVar52[3];
        *(ulong *)(pBVar19 + 0x10) = puVar52[2];
        *(ulong *)(pBVar19 + 0x18) = uVar34;
        if (0x20 < (long)uVar22) {
          lVar32 = 0;
          do {
            puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x20);
            uVar14 = puVar3[1];
            pBVar2 = pBVar19 + lVar32 + 0x20;
            *(undefined8 *)pBVar2 = *puVar3;
            *(undefined8 *)(pBVar2 + 8) = uVar14;
            puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x30);
            uVar14 = puVar3[1];
            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
            *(undefined8 *)(pBVar2 + 0x18) = uVar14;
            lVar32 = lVar32 + 0x20;
          } while (pBVar2 + 0x20 < pBVar19 + uVar22);
        }
LAB_0016ccd0:
        seqStore->lit = seqStore->lit + uVar22;
        if (0xffff < uVar22) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0016ec89;
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
LAB_0016ce81:
        uVar34 = sVar18 + 4;
        psVar45 = seqStore->sequences;
        psVar45->litLength = (U16)uVar22;
        psVar45->offBase = 1;
        if (2 < uVar34) {
          uVar22 = sVar18 + 1;
          uVar43 = uVar37;
          if (uVar22 < 0x10000) goto LAB_0016d295;
          if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_0016d27c;
          goto LAB_0016eb72;
        }
        goto LAB_0016eb15;
      }
      goto LAB_0016ec2c;
    }
  }
  else if (uVar39 == 7) {
    if (uVar35 < uVar36) {
LAB_0016ebb0:
      __assert_fail("endIndex - prefixStartIndex <= maxDistance",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x71a0,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                   );
    }
    if (uVar4 < uVar33) {
LAB_0016ebcf:
      __assert_fail("prefixStartIndex >= (U32)(dictEnd - dictBase)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x71a7,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                   );
    }
    if ((ms->prefetchCDictTables != 0) && (uVar42 < 0x3e)) {
      uVar34 = 0;
      do {
        uVar34 = uVar34 + 0x40;
      } while (uVar34 < (ulong)(4L << (bVar20 & 0x3f)));
    }
    if (uVar28 < uVar37) {
LAB_0016ebee:
      __assert_fail("offset_1 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x71b3,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                   );
    }
    if (uVar28 < local_130) {
LAB_0016ec0d:
      __assert_fail("offset_2 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x71b4,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                   );
    }
    puVar48 = (ulong *)((long)src + uVar47);
    if (puVar48 <= puVar29) {
      if ((uVar6 < 0x21) && (uVar43 < 0x21)) {
        bVar21 = 0x40 - cVar15;
        puVar1 = iEnd + -4;
        puVar25 = (ulong *)((long)src + (ulong)(iVar27 == iVar49));
LAB_0016bfd7:
        uVar22 = *puVar25 * -0x30e44323405a9d00;
        uVar40 = uVar22 >> (0x38 - bVar20 & 0x3f);
        uVar44 = (ulong)pUVar11[uVar40 >> 8];
        uVar40 = uVar40 ^ uVar44;
        puVar23 = puVar25 + 0x20;
        uVar34 = uVar47;
LAB_0016c014:
        puVar24 = puVar48;
        uVar30 = uVar22 >> (bVar21 & 0x3f);
        uVar43 = pUVar12[uVar30];
        uVar17 = (ulong)uVar43;
        UVar46 = (U32)((long)puVar25 - (long)pBVar9);
        uVar42 = (UVar46 - uVar37) + 1;
        uVar22 = *puVar24 * -0x30e44323405a9d00;
        uVar38 = uVar22 >> (0x38 - bVar20 & 0x3f);
        pUVar12[uVar30] = UVar46;
        if ((uVar4 - 1) - uVar42 < 3) {
LAB_0016c091:
          puVar48 = puVar25;
          if ((char)uVar40 == '\0') {
            uVar40 = uVar44 >> 8;
            uVar42 = (uint)(uVar44 >> 8);
            if (((uVar5 < uVar42) && (*(int *)(pBVar10 + uVar40) == (int)*puVar25)) &&
               (uVar43 <= uVar4)) {
              sVar18 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar25 + 4),pBVar10 + uVar40 + 4,(BYTE *)iEnd,
                                  (BYTE *)mEnd,iStart);
              uVar34 = sVar18 + 4;
              if (puVar25 <= puVar52) goto LAB_0016c5f3;
              pBVar19 = pBVar10 + (uVar40 - 1);
              goto LAB_0016c33a;
            }
          }
          if ((uVar4 < uVar43) && (piVar31 = (int *)(pBVar9 + uVar17), *piVar31 == (int)*puVar25))
          goto LAB_0016c1f5;
          uVar34 = (uVar34 + 1) - (ulong)(puVar24 < puVar23);
          if (puVar29 < (ulong *)((long)puVar24 + uVar34)) goto LAB_0016eab3;
          puVar23 = puVar23 + (ulong)(puVar23 <= puVar24) * 0x20;
          uVar44 = (ulong)pUVar11[uVar38 >> 8];
          uVar40 = uVar38 ^ uVar44;
          puVar48 = (ulong *)((long)puVar24 + uVar34);
          puVar25 = puVar24;
          goto LAB_0016c014;
        }
        piVar31 = (int *)(pBVar9 + uVar42);
        if (uVar42 < uVar4) {
          piVar31 = (int *)(pBVar10 + (uVar42 - uVar26));
        }
        if (*piVar31 != *(int *)((long)puVar25 + 1)) goto LAB_0016c091;
        puVar48 = iEnd;
        if (uVar42 < uVar4) {
          puVar48 = mEnd;
        }
        sVar18 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar25 + 5),(BYTE *)(piVar31 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar48,iStart);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_0016ead7;
        if (0x20000 < seqStore->maxNbLit) goto LAB_0016eaf6;
        puVar48 = (ulong *)((long)puVar25 + 1);
        uVar22 = (long)puVar48 - (long)puVar52;
        puVar23 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar23 + uVar22))
        goto LAB_0016eb53;
        if (iEnd < puVar48) goto LAB_0016eb34;
        if (puVar1 < puVar48) {
          ZSTD_safecopyLiterals((BYTE *)puVar23,(BYTE *)puVar52,(BYTE *)puVar48,(BYTE *)puVar1);
          goto LAB_0016c1bd;
        }
        uVar34 = puVar52[1];
        *puVar23 = *puVar52;
        puVar23[1] = uVar34;
        pBVar19 = seqStore->lit;
        if (uVar22 < 0x11) {
          seqStore->lit = pBVar19 + uVar22;
          goto LAB_0016c36e;
        }
        if (0xffffffffffffffe0 < (ulong)((long)(pBVar19 + 0x10) + (-0x10 - (long)(puVar52 + 2))))
        goto LAB_0016eca8;
        uVar34 = puVar52[3];
        *(ulong *)(pBVar19 + 0x10) = puVar52[2];
        *(ulong *)(pBVar19 + 0x18) = uVar34;
        if (0x20 < (long)uVar22) {
          lVar32 = 0;
          do {
            puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x20);
            uVar14 = puVar3[1];
            pBVar2 = pBVar19 + lVar32 + 0x20;
            *(undefined8 *)pBVar2 = *puVar3;
            *(undefined8 *)(pBVar2 + 8) = uVar14;
            puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x30);
            uVar14 = puVar3[1];
            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
            *(undefined8 *)(pBVar2 + 0x18) = uVar14;
            lVar32 = lVar32 + 0x20;
          } while (pBVar2 + 0x20 < pBVar19 + uVar22);
        }
LAB_0016c1bd:
        seqStore->lit = seqStore->lit + uVar22;
        if (0xffff < uVar22) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_0016ec89:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
LAB_0016c36e:
        uVar34 = sVar18 + 4;
        psVar45 = seqStore->sequences;
        psVar45->litLength = (U16)uVar22;
        psVar45->offBase = 1;
        if (uVar34 < 3) {
LAB_0016eb15:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar22 = sVar18 + 1;
        uVar43 = uVar37;
        if (uVar22 < 0x10000) goto LAB_0016c782;
        if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_0016c769;
LAB_0016eb72:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46ad,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
LAB_0016ec2c:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
  }
  else {
    if (uVar35 < uVar36) goto LAB_0016ebb0;
    if (uVar4 < uVar33) goto LAB_0016ebcf;
    if ((ms->prefetchCDictTables != 0) && (uVar42 < 0x3e)) {
      uVar34 = 0;
      do {
        uVar34 = uVar34 + 0x40;
      } while (uVar34 < (ulong)(4L << (bVar20 & 0x3f)));
    }
    if (uVar28 < uVar37) goto LAB_0016ebee;
    if (uVar28 < local_130) goto LAB_0016ec0d;
    puVar48 = (ulong *)((long)src + uVar47);
    if (puVar48 <= puVar29) {
      if ((uVar6 < 0x21) && (uVar43 < 0x21)) {
        bVar21 = 0x20 - cVar15;
        puVar1 = iEnd + -4;
        puVar25 = (ulong *)((long)src + (ulong)(iVar27 == iVar49));
LAB_0016e117:
        uVar42 = (int)*puVar25 * -0x61c8864f;
        uVar39 = uVar42 >> (0x18 - bVar20 & 0x1f);
        uVar43 = pUVar11[uVar39 >> 8];
        uVar39 = uVar39 ^ uVar43;
        puVar23 = puVar25 + 0x20;
        uVar34 = uVar47;
LAB_0016e152:
        uVar28 = uVar42 >> (bVar21 & 0x1f);
        uVar6 = pUVar12[uVar28];
        uVar22 = (ulong)uVar6;
        UVar46 = (U32)((long)puVar25 - (long)pBVar9);
        uVar35 = (UVar46 - uVar37) + 1;
        uVar42 = (int)*puVar48 * -0x61c8864f;
        uVar33 = uVar42 >> (0x18 - bVar20 & 0x1f);
        pUVar12[uVar28] = UVar46;
        if ((uVar4 - 1) - uVar35 < 3) {
LAB_0016e1c4:
          puVar24 = puVar25;
          if ((char)uVar39 == '\0') {
            uVar43 = uVar43 >> 8;
            if (((uVar5 < uVar43) && (*(int *)(pBVar10 + uVar43) == (int)*puVar25)) &&
               (uVar6 <= uVar4)) {
              sVar18 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar25 + 4),pBVar10 + (ulong)uVar43 + 4,
                                  (BYTE *)iEnd,(BYTE *)mEnd,iStart);
              uVar34 = sVar18 + 4;
              if (puVar25 <= puVar52) goto LAB_0016e71a;
              pBVar19 = pBVar10 + ((ulong)uVar43 - 1);
              goto LAB_0016e469;
            }
          }
          if ((uVar4 < uVar6) && (piVar31 = (int *)(pBVar9 + uVar22), *piVar31 == (int)*puVar25))
          goto LAB_0016e327;
          uVar34 = (uVar34 + 1) - (ulong)(puVar48 < puVar23);
          if (puVar29 < (ulong *)((long)puVar48 + uVar34)) goto LAB_0016eab3;
          puVar23 = puVar23 + (ulong)(puVar23 <= puVar48) * 0x20;
          uVar43 = pUVar11[uVar33 >> 8];
          uVar39 = uVar33 ^ uVar43;
          puVar25 = puVar48;
          puVar48 = (ulong *)((long)puVar48 + uVar34);
          goto LAB_0016e152;
        }
        piVar31 = (int *)(pBVar9 + uVar35);
        if (uVar35 < uVar4) {
          piVar31 = (int *)(pBVar10 + (uVar35 - uVar26));
        }
        if (*piVar31 != *(int *)((long)puVar25 + 1)) goto LAB_0016e1c4;
        puVar48 = iEnd;
        if (uVar35 < uVar4) {
          puVar48 = mEnd;
        }
        sVar18 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar25 + 5),(BYTE *)(piVar31 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar48,iStart);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_0016ead7;
        if (0x20000 < seqStore->maxNbLit) goto LAB_0016eaf6;
        puVar24 = (ulong *)((long)puVar25 + 1);
        uVar22 = (long)puVar24 - (long)puVar52;
        puVar48 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar48 + uVar22))
        goto LAB_0016eb53;
        if (iEnd < puVar24) goto LAB_0016eb34;
        if (puVar1 < puVar24) {
          ZSTD_safecopyLiterals((BYTE *)puVar48,(BYTE *)puVar52,(BYTE *)puVar24,(BYTE *)puVar1);
          goto LAB_0016e2ef;
        }
        uVar34 = puVar52[1];
        *puVar48 = *puVar52;
        puVar48[1] = uVar34;
        pBVar19 = seqStore->lit;
        if (uVar22 < 0x11) {
          seqStore->lit = pBVar19 + uVar22;
          goto LAB_0016e49d;
        }
        if (0xffffffffffffffe0 < (ulong)((long)(pBVar19 + 0x10) + (-0x10 - (long)(puVar52 + 2))))
        goto LAB_0016eca8;
        uVar34 = puVar52[3];
        *(ulong *)(pBVar19 + 0x10) = puVar52[2];
        *(ulong *)(pBVar19 + 0x18) = uVar34;
        if (0x20 < (long)uVar22) {
          lVar32 = 0;
          do {
            puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x20);
            uVar14 = puVar3[1];
            pBVar2 = pBVar19 + lVar32 + 0x20;
            *(undefined8 *)pBVar2 = *puVar3;
            *(undefined8 *)(pBVar2 + 8) = uVar14;
            puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x30);
            uVar14 = puVar3[1];
            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
            *(undefined8 *)(pBVar2 + 0x18) = uVar14;
            lVar32 = lVar32 + 0x20;
          } while (pBVar2 + 0x20 < pBVar19 + uVar22);
        }
LAB_0016e2ef:
        seqStore->lit = seqStore->lit + uVar22;
        if (0xffff < uVar22) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0016ec89;
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
LAB_0016e49d:
        uVar34 = sVar18 + 4;
        psVar45 = seqStore->sequences;
        psVar45->litLength = (U16)uVar22;
        psVar45->offBase = 1;
        if (2 < uVar34) {
          uVar22 = sVar18 + 1;
          uVar43 = uVar37;
          if (uVar22 < 0x10000) goto LAB_0016e893;
          if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_0016e87a;
          goto LAB_0016eb72;
        }
        goto LAB_0016eb15;
      }
      goto LAB_0016ec2c;
    }
  }
LAB_0016eab3:
  *rep = uVar37;
  rep[1] = local_130;
  return (long)iEnd - (long)puVar52;
  while (bVar13 = pBVar50 < pBVar19, pBVar19 = pBVar19 + -1, bVar13) {
LAB_0016d95c:
    puVar23 = (ulong *)((long)puVar48 + -1);
    if ((*(BYTE *)puVar23 != *pBVar19) ||
       (uVar34 = uVar34 + 1, puVar48 = puVar23, puVar23 <= puVar52)) break;
  }
LAB_0016dc18:
  uVar43 = UVar46 - (uVar42 + uVar26);
  if (uVar43 == 0) goto LAB_0016ecc7;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_0016ead7;
  if (0x20000 < seqStore->maxNbLit) goto LAB_0016eaf6;
  uVar22 = (long)puVar48 - (long)puVar52;
  puVar23 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar23 + uVar22)) goto LAB_0016eb53;
  if (iEnd < puVar48) goto LAB_0016eb34;
  if (puVar1 < puVar48) {
    ZSTD_safecopyLiterals((BYTE *)puVar23,(BYTE *)puVar52,(BYTE *)puVar48,(BYTE *)puVar1);
LAB_0016dc97:
    seqStore->lit = seqStore->lit + uVar22;
    if (0xffff < uVar22) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0016ec89;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar40 = puVar52[1];
    *puVar23 = *puVar52;
    puVar23[1] = uVar40;
    pBVar19 = seqStore->lit;
    if (0x10 < uVar22) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar19 + 0x10) + (-0x10 - (long)(puVar52 + 2))))
      goto LAB_0016eca8;
      uVar40 = puVar52[3];
      *(ulong *)(pBVar19 + 0x10) = puVar52[2];
      *(ulong *)(pBVar19 + 0x18) = uVar40;
      if (0x20 < (long)uVar22) {
        lVar32 = 0;
        do {
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x20);
          uVar14 = puVar3[1];
          pBVar2 = pBVar19 + lVar32 + 0x20;
          *(undefined8 *)pBVar2 = *puVar3;
          *(undefined8 *)(pBVar2 + 8) = uVar14;
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x30);
          uVar14 = puVar3[1];
          *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
          *(undefined8 *)(pBVar2 + 0x18) = uVar14;
          lVar32 = lVar32 + 0x20;
        } while (pBVar2 + 0x20 < pBVar19 + uVar22);
      }
      goto LAB_0016dc97;
    }
    seqStore->lit = pBVar19 + uVar22;
  }
  psVar45 = seqStore->sequences;
  psVar45->litLength = (U16)uVar22;
  psVar45->offBase = uVar43 + 3;
  if (uVar34 < 3) goto LAB_0016eb15;
  uVar22 = uVar34 - 3;
  local_130 = uVar37;
  if (uVar22 < 0x10000) goto LAB_0016dda7;
  ZVar7 = seqStore->longLengthType;
  goto joined_r0x0016dd88;
LAB_0016d817:
  puVar23 = (ulong *)((long)puVar25 + 4);
  puVar24 = (ulong *)(piVar31 + 1);
  puVar51 = puVar23;
  if (puVar23 < (ulong *)((long)iEnd - 7U)) {
    if (*puVar24 == *puVar23) {
      lVar32 = 0;
      do {
        puVar24 = (ulong *)((long)puVar25 + lVar32 + 0xc);
        if ((ulong *)((long)iEnd - 7U) <= puVar24) {
          puVar24 = (ulong *)(pBVar9 + lVar32 + uVar17 + 0xc);
          puVar51 = (ulong *)((long)puVar25 + lVar32 + 0xc);
          goto LAB_0016d9fb;
        }
        lVar16 = lVar32 + uVar17 + 0xc;
        uVar34 = *puVar24;
        lVar32 = lVar32 + 8;
      } while (*(ulong *)(pBVar9 + lVar16) == uVar34);
      uVar34 = uVar34 ^ *(ulong *)(pBVar9 + lVar16);
      uVar22 = 0;
      if (uVar34 != 0) {
        for (; (uVar34 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
        }
      }
      uVar34 = (uVar22 >> 3 & 0x1fffffff) + lVar32;
    }
    else {
      uVar22 = *puVar23 ^ *puVar24;
      uVar34 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
        }
      }
      uVar34 = uVar34 >> 3 & 0x1fffffff;
    }
  }
  else {
LAB_0016d9fb:
    if ((puVar51 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar24 == (int)*puVar51)) {
      puVar51 = (ulong *)((long)puVar51 + 4);
      puVar24 = (ulong *)((long)puVar24 + 4);
    }
    if ((puVar51 < (ulong *)((long)iEnd + -1)) && ((short)*puVar24 == (short)*puVar51)) {
      puVar51 = (ulong *)((long)puVar51 + 2);
      puVar24 = (ulong *)((long)puVar24 + 2);
    }
    if (puVar51 < iEnd) {
      puVar51 = (ulong *)((long)puVar51 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar51));
    }
    uVar34 = (long)puVar51 - (long)puVar23;
  }
  uVar34 = uVar34 + 4;
  if (puVar52 < puVar25) {
    pBVar19 = pBVar9 + (uVar17 - 1);
    do {
      puVar23 = (ulong *)((long)puVar48 + -1);
      if ((*(BYTE *)puVar23 != *pBVar19) ||
         (uVar34 = uVar34 + 1, puVar48 = puVar23, puVar23 <= puVar52)) break;
      bVar13 = iStart < pBVar19;
      pBVar19 = pBVar19 + -1;
    } while (bVar13);
  }
  uVar43 = (int)puVar25 - (int)piVar31;
  if (uVar43 == 0) goto LAB_0016ec6a;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_0016ead7;
  if (0x20000 < seqStore->maxNbLit) goto LAB_0016eaf6;
  uVar22 = (long)puVar48 - (long)puVar52;
  puVar23 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar23 + uVar22)) goto LAB_0016eb53;
  if (iEnd < puVar48) goto LAB_0016eb34;
  if (puVar1 < puVar48) {
    ZSTD_safecopyLiterals((BYTE *)puVar23,(BYTE *)puVar52,(BYTE *)puVar48,(BYTE *)puVar1);
LAB_0016db17:
    seqStore->lit = seqStore->lit + uVar22;
    if (0xffff < uVar22) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0016ec89;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar40 = puVar52[1];
    *puVar23 = *puVar52;
    puVar23[1] = uVar40;
    pBVar19 = seqStore->lit;
    if (0x10 < uVar22) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar19 + 0x10) + (-0x10 - (long)(puVar52 + 2))))
      goto LAB_0016eca8;
      uVar40 = puVar52[3];
      *(ulong *)(pBVar19 + 0x10) = puVar52[2];
      *(ulong *)(pBVar19 + 0x18) = uVar40;
      if (0x20 < (long)uVar22) {
        lVar32 = 0;
        do {
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x20);
          uVar14 = puVar3[1];
          pBVar2 = pBVar19 + lVar32 + 0x20;
          *(undefined8 *)pBVar2 = *puVar3;
          *(undefined8 *)(pBVar2 + 8) = uVar14;
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x30);
          uVar14 = puVar3[1];
          *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
          *(undefined8 *)(pBVar2 + 0x18) = uVar14;
          lVar32 = lVar32 + 0x20;
        } while (pBVar2 + 0x20 < pBVar19 + uVar22);
      }
      goto LAB_0016db17;
    }
    seqStore->lit = pBVar19 + uVar22;
  }
  psVar45 = seqStore->sequences;
  psVar45->litLength = (U16)uVar22;
  psVar45->offBase = uVar43 + 3;
  if (uVar34 < 3) goto LAB_0016eb15;
  uVar22 = uVar34 - 3;
  local_130 = uVar37;
  if (uVar22 < 0x10000) goto LAB_0016dda7;
  ZVar7 = seqStore->longLengthType;
joined_r0x0016dd88:
  local_130 = uVar37;
  if (ZVar7 != ZSTD_llt_none) goto LAB_0016eb72;
LAB_0016dd8e:
  seqStore->longLengthType = ZSTD_llt_matchLength;
  seqStore->longLengthPos = (U32)((ulong)((long)psVar45 - (long)seqStore->sequencesStart) >> 3);
LAB_0016dda7:
  uVar37 = uVar43;
  puVar52 = (ulong *)(uVar34 + (long)puVar48);
  psVar45->mlBase = (U16)uVar22;
  psVar45 = psVar45 + 1;
  seqStore->sequences = psVar45;
  if (puVar52 <= puVar29) {
    if (pBVar9 + ((long)puVar25 - (long)pBVar9 & 0xffffffffU) + 2 <= src) goto LAB_0016ec4b;
    pUVar12[(ulong)(*(long *)(pBVar9 + ((long)puVar25 - (long)pBVar9 & 0xffffffffU) + 2) *
                   -0x30e4432345000000) >> (bVar21 & 0x3f)] = UVar46 + 2;
    pUVar12[(ulong)(*(long *)((long)puVar52 + -2) * -0x30e4432345000000) >> (bVar21 & 0x3f)] =
         ((int)puVar52 + -2) - iVar41;
    do {
      uVar42 = uVar37;
      UVar46 = (int)puVar52 - iVar41;
      uVar43 = UVar46 - local_130;
      pBVar19 = pBVar9;
      if (uVar43 < uVar4) {
        pBVar19 = pBVar10 + -(ulong)uVar26;
      }
      uVar37 = uVar42;
      if (((uVar4 - 1) - uVar43 < 3) || (*(int *)(pBVar19 + uVar43) != (int)*puVar52)) break;
      puVar48 = iEnd;
      if (uVar43 < uVar4) {
        puVar48 = mEnd;
      }
      sVar18 = ZSTD_count_2segments
                         ((BYTE *)((long)puVar52 + 4),(BYTE *)((long)(pBVar19 + uVar43) + 4),
                          (BYTE *)iEnd,(BYTE *)puVar48,iStart);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar45 - (long)seqStore->sequencesStart >> 3))
      goto LAB_0016ead7;
      if (0x20000 < seqStore->maxNbLit) goto LAB_0016eaf6;
      puVar48 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar48) goto LAB_0016eb53;
      if (iEnd < puVar52) goto LAB_0016eb34;
      if (puVar1 < puVar52) {
        ZSTD_safecopyLiterals((BYTE *)puVar48,(BYTE *)puVar52,(BYTE *)puVar52,(BYTE *)puVar1);
      }
      else {
        uVar34 = puVar52[1];
        *puVar48 = *puVar52;
        puVar48[1] = uVar34;
      }
      psVar45 = seqStore->sequences;
      psVar45->litLength = 0;
      psVar45->offBase = 1;
      if (sVar18 + 4 < 3) goto LAB_0016eb15;
      if (0xffff < sVar18 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0016eb72;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar45 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar45->mlBase = (U16)(sVar18 + 1);
      psVar45 = psVar45 + 1;
      seqStore->sequences = psVar45;
      pUVar12[*puVar52 * -0x30e4432345000000 >> (bVar21 & 0x3f)] = UVar46;
      puVar52 = (ulong *)((long)puVar52 + sVar18 + 4);
      uVar37 = local_130;
      local_130 = uVar42;
    } while (puVar52 <= puVar29);
  }
  puVar48 = (ulong *)((long)puVar52 + uVar47);
  puVar25 = puVar52;
  if (puVar29 < puVar48) goto LAB_0016eab3;
  goto LAB_0016d5f1;
  while (bVar13 = pBVar50 < pBVar19, pBVar19 = pBVar19 + -1, bVar13) {
LAB_0016ce4d:
    puVar23 = (ulong *)((long)puVar48 + -1);
    if ((*(BYTE *)puVar23 != *pBVar19) ||
       (uVar34 = uVar34 + 1, puVar48 = puVar23, puVar23 <= puVar52)) break;
  }
LAB_0016d106:
  uVar43 = UVar46 - (uVar42 + uVar26);
  if (uVar43 == 0) goto LAB_0016ecc7;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_0016ead7;
  if (0x20000 < seqStore->maxNbLit) goto LAB_0016eaf6;
  uVar22 = (long)puVar48 - (long)puVar52;
  puVar23 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar23 + uVar22)) goto LAB_0016eb53;
  if (iEnd < puVar48) goto LAB_0016eb34;
  if (puVar1 < puVar48) {
    ZSTD_safecopyLiterals((BYTE *)puVar23,(BYTE *)puVar52,(BYTE *)puVar48,(BYTE *)puVar1);
LAB_0016d185:
    seqStore->lit = seqStore->lit + uVar22;
    if (0xffff < uVar22) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0016ec89;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar40 = puVar52[1];
    *puVar23 = *puVar52;
    puVar23[1] = uVar40;
    pBVar19 = seqStore->lit;
    if (0x10 < uVar22) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar19 + 0x10) + (-0x10 - (long)(puVar52 + 2))))
      goto LAB_0016eca8;
      uVar40 = puVar52[3];
      *(ulong *)(pBVar19 + 0x10) = puVar52[2];
      *(ulong *)(pBVar19 + 0x18) = uVar40;
      if (0x20 < (long)uVar22) {
        lVar32 = 0;
        do {
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x20);
          uVar14 = puVar3[1];
          pBVar2 = pBVar19 + lVar32 + 0x20;
          *(undefined8 *)pBVar2 = *puVar3;
          *(undefined8 *)(pBVar2 + 8) = uVar14;
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x30);
          uVar14 = puVar3[1];
          *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
          *(undefined8 *)(pBVar2 + 0x18) = uVar14;
          lVar32 = lVar32 + 0x20;
        } while (pBVar2 + 0x20 < pBVar19 + uVar22);
      }
      goto LAB_0016d185;
    }
    seqStore->lit = pBVar19 + uVar22;
  }
  psVar45 = seqStore->sequences;
  psVar45->litLength = (U16)uVar22;
  psVar45->offBase = uVar43 + 3;
  if (uVar34 < 3) goto LAB_0016eb15;
  uVar22 = uVar34 - 3;
  local_130 = uVar37;
  if (uVar22 < 0x10000) goto LAB_0016d295;
  ZVar7 = seqStore->longLengthType;
  goto joined_r0x0016d276;
LAB_0016cd08:
  puVar23 = (ulong *)((long)puVar25 + 4);
  puVar24 = (ulong *)(piVar31 + 1);
  puVar51 = puVar23;
  if (puVar23 < (ulong *)((long)iEnd - 7U)) {
    if (*puVar24 == *puVar23) {
      lVar32 = 0;
      do {
        puVar24 = (ulong *)((long)puVar25 + lVar32 + 0xc);
        if ((ulong *)((long)iEnd - 7U) <= puVar24) {
          puVar24 = (ulong *)(pBVar9 + lVar32 + uVar17 + 0xc);
          puVar51 = (ulong *)((long)puVar25 + lVar32 + 0xc);
          goto LAB_0016ceec;
        }
        lVar16 = lVar32 + uVar17 + 0xc;
        uVar34 = *puVar24;
        lVar32 = lVar32 + 8;
      } while (*(ulong *)(pBVar9 + lVar16) == uVar34);
      uVar34 = uVar34 ^ *(ulong *)(pBVar9 + lVar16);
      uVar22 = 0;
      if (uVar34 != 0) {
        for (; (uVar34 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
        }
      }
      uVar34 = (uVar22 >> 3 & 0x1fffffff) + lVar32;
    }
    else {
      uVar22 = *puVar23 ^ *puVar24;
      uVar34 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
        }
      }
      uVar34 = uVar34 >> 3 & 0x1fffffff;
    }
  }
  else {
LAB_0016ceec:
    if ((puVar51 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar24 == (int)*puVar51)) {
      puVar51 = (ulong *)((long)puVar51 + 4);
      puVar24 = (ulong *)((long)puVar24 + 4);
    }
    if ((puVar51 < (ulong *)((long)iEnd + -1)) && ((short)*puVar24 == (short)*puVar51)) {
      puVar51 = (ulong *)((long)puVar51 + 2);
      puVar24 = (ulong *)((long)puVar24 + 2);
    }
    if (puVar51 < iEnd) {
      puVar51 = (ulong *)((long)puVar51 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar51));
    }
    uVar34 = (long)puVar51 - (long)puVar23;
  }
  uVar34 = uVar34 + 4;
  if (puVar52 < puVar25) {
    pBVar19 = pBVar9 + (uVar17 - 1);
    do {
      puVar23 = (ulong *)((long)puVar48 + -1);
      if ((*(BYTE *)puVar23 != *pBVar19) ||
         (uVar34 = uVar34 + 1, puVar48 = puVar23, puVar23 <= puVar52)) break;
      bVar13 = iStart < pBVar19;
      pBVar19 = pBVar19 + -1;
    } while (bVar13);
  }
  uVar43 = (int)puVar25 - (int)piVar31;
  if (uVar43 == 0) goto LAB_0016ec6a;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_0016ead7;
  if (0x20000 < seqStore->maxNbLit) goto LAB_0016eaf6;
  uVar22 = (long)puVar48 - (long)puVar52;
  puVar23 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar23 + uVar22)) goto LAB_0016eb53;
  if (iEnd < puVar48) goto LAB_0016eb34;
  if (puVar1 < puVar48) {
    ZSTD_safecopyLiterals((BYTE *)puVar23,(BYTE *)puVar52,(BYTE *)puVar48,(BYTE *)puVar1);
LAB_0016d005:
    seqStore->lit = seqStore->lit + uVar22;
    if (0xffff < uVar22) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0016ec89;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar40 = puVar52[1];
    *puVar23 = *puVar52;
    puVar23[1] = uVar40;
    pBVar19 = seqStore->lit;
    if (0x10 < uVar22) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar19 + 0x10) + (-0x10 - (long)(puVar52 + 2))))
      goto LAB_0016eca8;
      uVar40 = puVar52[3];
      *(ulong *)(pBVar19 + 0x10) = puVar52[2];
      *(ulong *)(pBVar19 + 0x18) = uVar40;
      if (0x20 < (long)uVar22) {
        lVar32 = 0;
        do {
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x20);
          uVar14 = puVar3[1];
          pBVar2 = pBVar19 + lVar32 + 0x20;
          *(undefined8 *)pBVar2 = *puVar3;
          *(undefined8 *)(pBVar2 + 8) = uVar14;
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x30);
          uVar14 = puVar3[1];
          *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
          *(undefined8 *)(pBVar2 + 0x18) = uVar14;
          lVar32 = lVar32 + 0x20;
        } while (pBVar2 + 0x20 < pBVar19 + uVar22);
      }
      goto LAB_0016d005;
    }
    seqStore->lit = pBVar19 + uVar22;
  }
  psVar45 = seqStore->sequences;
  psVar45->litLength = (U16)uVar22;
  psVar45->offBase = uVar43 + 3;
  if (uVar34 < 3) goto LAB_0016eb15;
  uVar22 = uVar34 - 3;
  local_130 = uVar37;
  if (uVar22 < 0x10000) goto LAB_0016d295;
  ZVar7 = seqStore->longLengthType;
joined_r0x0016d276:
  local_130 = uVar37;
  if (ZVar7 != ZSTD_llt_none) goto LAB_0016eb72;
LAB_0016d27c:
  seqStore->longLengthType = ZSTD_llt_matchLength;
  seqStore->longLengthPos = (U32)((ulong)((long)psVar45 - (long)seqStore->sequencesStart) >> 3);
LAB_0016d295:
  uVar37 = uVar43;
  puVar52 = (ulong *)(uVar34 + (long)puVar48);
  psVar45->mlBase = (U16)uVar22;
  psVar45 = psVar45 + 1;
  seqStore->sequences = psVar45;
  if (puVar52 <= puVar29) {
    if (pBVar9 + ((long)puVar25 - (long)pBVar9 & 0xffffffffU) + 2 <= src) goto LAB_0016ec4b;
    pUVar12[(ulong)(*(long *)(pBVar9 + ((long)puVar25 - (long)pBVar9 & 0xffffffffU) + 2) *
                   -0x30e4432340650000) >> (bVar21 & 0x3f)] = UVar46 + 2;
    pUVar12[(ulong)(*(long *)((long)puVar52 + -2) * -0x30e4432340650000) >> (bVar21 & 0x3f)] =
         ((int)puVar52 + -2) - iVar41;
    do {
      uVar42 = uVar37;
      UVar46 = (int)puVar52 - iVar41;
      uVar43 = UVar46 - local_130;
      pBVar19 = pBVar9;
      if (uVar43 < uVar4) {
        pBVar19 = pBVar10 + -(ulong)uVar26;
      }
      uVar37 = uVar42;
      if (((uVar4 - 1) - uVar43 < 3) || (*(int *)(pBVar19 + uVar43) != (int)*puVar52)) break;
      puVar48 = iEnd;
      if (uVar43 < uVar4) {
        puVar48 = mEnd;
      }
      sVar18 = ZSTD_count_2segments
                         ((BYTE *)((long)puVar52 + 4),(BYTE *)((long)(pBVar19 + uVar43) + 4),
                          (BYTE *)iEnd,(BYTE *)puVar48,iStart);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar45 - (long)seqStore->sequencesStart >> 3))
      goto LAB_0016ead7;
      if (0x20000 < seqStore->maxNbLit) goto LAB_0016eaf6;
      puVar48 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar48) goto LAB_0016eb53;
      if (iEnd < puVar52) goto LAB_0016eb34;
      if (puVar1 < puVar52) {
        ZSTD_safecopyLiterals((BYTE *)puVar48,(BYTE *)puVar52,(BYTE *)puVar52,(BYTE *)puVar1);
      }
      else {
        uVar34 = puVar52[1];
        *puVar48 = *puVar52;
        puVar48[1] = uVar34;
      }
      psVar45 = seqStore->sequences;
      psVar45->litLength = 0;
      psVar45->offBase = 1;
      if (sVar18 + 4 < 3) goto LAB_0016eb15;
      if (0xffff < sVar18 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0016eb72;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar45 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar45->mlBase = (U16)(sVar18 + 1);
      psVar45 = psVar45 + 1;
      seqStore->sequences = psVar45;
      pUVar12[*puVar52 * -0x30e4432340650000 >> (bVar21 & 0x3f)] = UVar46;
      puVar52 = (ulong *)((long)puVar52 + sVar18 + 4);
      uVar37 = local_130;
      local_130 = uVar42;
    } while (puVar52 <= puVar29);
  }
  puVar48 = (ulong *)((long)puVar52 + uVar47);
  puVar25 = puVar52;
  if (puVar29 < puVar48) goto LAB_0016eab3;
  goto LAB_0016caea;
  while (bVar13 = pBVar50 < pBVar19, pBVar19 = pBVar19 + -1, bVar13) {
LAB_0016e469:
    puVar48 = (ulong *)((long)puVar24 + -1);
    if ((*(BYTE *)puVar48 != *pBVar19) ||
       (uVar34 = uVar34 + 1, puVar24 = puVar48, puVar48 <= puVar52)) break;
  }
LAB_0016e71a:
  uVar43 = UVar46 - (uVar43 + uVar26);
  if (uVar43 == 0) goto LAB_0016ecc7;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_0016ead7;
  if (0x20000 < seqStore->maxNbLit) goto LAB_0016eaf6;
  uVar22 = (long)puVar24 - (long)puVar52;
  puVar48 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar48 + uVar22)) goto LAB_0016eb53;
  if (iEnd < puVar24) goto LAB_0016eb34;
  if (puVar1 < puVar24) {
    ZSTD_safecopyLiterals((BYTE *)puVar48,(BYTE *)puVar52,(BYTE *)puVar24,(BYTE *)puVar1);
LAB_0016e790:
    seqStore->lit = seqStore->lit + uVar22;
    if (0xffff < uVar22) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0016ec89;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar40 = puVar52[1];
    *puVar48 = *puVar52;
    puVar48[1] = uVar40;
    pBVar19 = seqStore->lit;
    if (0x10 < uVar22) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar19 + 0x10) + (-0x10 - (long)(puVar52 + 2))))
      goto LAB_0016eca8;
      uVar40 = puVar52[3];
      *(ulong *)(pBVar19 + 0x10) = puVar52[2];
      *(ulong *)(pBVar19 + 0x18) = uVar40;
      if (0x20 < (long)uVar22) {
        lVar32 = 0;
        do {
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x20);
          uVar14 = puVar3[1];
          pBVar2 = pBVar19 + lVar32 + 0x20;
          *(undefined8 *)pBVar2 = *puVar3;
          *(undefined8 *)(pBVar2 + 8) = uVar14;
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x30);
          uVar14 = puVar3[1];
          *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
          *(undefined8 *)(pBVar2 + 0x18) = uVar14;
          lVar32 = lVar32 + 0x20;
        } while (pBVar2 + 0x20 < pBVar19 + uVar22);
      }
      goto LAB_0016e790;
    }
    seqStore->lit = pBVar19 + uVar22;
  }
  psVar45 = seqStore->sequences;
  psVar45->litLength = (U16)uVar22;
  psVar45->offBase = uVar43 + 3;
  if (uVar34 < 3) goto LAB_0016eb15;
  uVar22 = uVar34 - 3;
  local_130 = uVar37;
  if (uVar22 < 0x10000) goto LAB_0016e893;
  ZVar7 = seqStore->longLengthType;
  goto joined_r0x0016e874;
LAB_0016e327:
  puVar48 = (ulong *)((long)puVar25 + 4);
  puVar23 = (ulong *)(piVar31 + 1);
  puVar51 = puVar48;
  if (puVar48 < (ulong *)((long)iEnd - 7U)) {
    if (*puVar23 == *puVar48) {
      lVar32 = 0;
      do {
        puVar23 = (ulong *)((long)puVar25 + lVar32 + 0xc);
        if ((ulong *)((long)iEnd - 7U) <= puVar23) {
          puVar23 = (ulong *)(pBVar9 + lVar32 + uVar22 + 0xc);
          puVar51 = (ulong *)((long)puVar25 + lVar32 + 0xc);
          goto LAB_0016e507;
        }
        lVar16 = lVar32 + uVar22 + 0xc;
        uVar34 = *puVar23;
        lVar32 = lVar32 + 8;
      } while (*(ulong *)(pBVar9 + lVar16) == uVar34);
      uVar34 = uVar34 ^ *(ulong *)(pBVar9 + lVar16);
      uVar40 = 0;
      if (uVar34 != 0) {
        for (; (uVar34 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
        }
      }
      uVar34 = (uVar40 >> 3 & 0x1fffffff) + lVar32;
    }
    else {
      uVar40 = *puVar48 ^ *puVar23;
      uVar34 = 0;
      if (uVar40 != 0) {
        for (; (uVar40 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
        }
      }
      uVar34 = uVar34 >> 3 & 0x1fffffff;
    }
  }
  else {
LAB_0016e507:
    if ((puVar51 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar23 == (int)*puVar51)) {
      puVar51 = (ulong *)((long)puVar51 + 4);
      puVar23 = (ulong *)((long)puVar23 + 4);
    }
    if ((puVar51 < (ulong *)((long)iEnd + -1)) && ((short)*puVar23 == (short)*puVar51)) {
      puVar51 = (ulong *)((long)puVar51 + 2);
      puVar23 = (ulong *)((long)puVar23 + 2);
    }
    if (puVar51 < iEnd) {
      puVar51 = (ulong *)((long)puVar51 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar51));
    }
    uVar34 = (long)puVar51 - (long)puVar48;
  }
  uVar34 = uVar34 + 4;
  if (puVar52 < puVar25) {
    pBVar19 = pBVar9 + (uVar22 - 1);
    do {
      puVar48 = (ulong *)((long)puVar24 + -1);
      if ((*(BYTE *)puVar48 != *pBVar19) ||
         (uVar34 = uVar34 + 1, puVar24 = puVar48, puVar48 <= puVar52)) break;
      bVar13 = iStart < pBVar19;
      pBVar19 = pBVar19 + -1;
    } while (bVar13);
  }
  uVar43 = (int)puVar25 - (int)piVar31;
  if (uVar43 == 0) goto LAB_0016ec6a;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_0016ead7;
  if (0x20000 < seqStore->maxNbLit) goto LAB_0016eaf6;
  uVar22 = (long)puVar24 - (long)puVar52;
  puVar48 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar48 + uVar22)) goto LAB_0016eb53;
  if (iEnd < puVar24) goto LAB_0016eb34;
  if (puVar1 < puVar24) {
    ZSTD_safecopyLiterals((BYTE *)puVar48,(BYTE *)puVar52,(BYTE *)puVar24,(BYTE *)puVar1);
LAB_0016e61a:
    seqStore->lit = seqStore->lit + uVar22;
    if (0xffff < uVar22) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0016ec89;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar40 = puVar52[1];
    *puVar48 = *puVar52;
    puVar48[1] = uVar40;
    pBVar19 = seqStore->lit;
    if (0x10 < uVar22) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar19 + 0x10) + (-0x10 - (long)(puVar52 + 2))))
      goto LAB_0016eca8;
      uVar40 = puVar52[3];
      *(ulong *)(pBVar19 + 0x10) = puVar52[2];
      *(ulong *)(pBVar19 + 0x18) = uVar40;
      if (0x20 < (long)uVar22) {
        lVar32 = 0;
        do {
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x20);
          uVar14 = puVar3[1];
          pBVar2 = pBVar19 + lVar32 + 0x20;
          *(undefined8 *)pBVar2 = *puVar3;
          *(undefined8 *)(pBVar2 + 8) = uVar14;
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x30);
          uVar14 = puVar3[1];
          *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
          *(undefined8 *)(pBVar2 + 0x18) = uVar14;
          lVar32 = lVar32 + 0x20;
        } while (pBVar2 + 0x20 < pBVar19 + uVar22);
      }
      goto LAB_0016e61a;
    }
    seqStore->lit = pBVar19 + uVar22;
  }
  psVar45 = seqStore->sequences;
  psVar45->litLength = (U16)uVar22;
  psVar45->offBase = uVar43 + 3;
  if (uVar34 < 3) goto LAB_0016eb15;
  uVar22 = uVar34 - 3;
  local_130 = uVar37;
  if (uVar22 < 0x10000) goto LAB_0016e893;
  ZVar7 = seqStore->longLengthType;
joined_r0x0016e874:
  local_130 = uVar37;
  if (ZVar7 != ZSTD_llt_none) goto LAB_0016eb72;
LAB_0016e87a:
  seqStore->longLengthType = ZSTD_llt_matchLength;
  seqStore->longLengthPos = (U32)((ulong)((long)psVar45 - (long)seqStore->sequencesStart) >> 3);
LAB_0016e893:
  puVar52 = (ulong *)(uVar34 + (long)puVar24);
  psVar45->mlBase = (U16)uVar22;
  psVar45 = psVar45 + 1;
  seqStore->sequences = psVar45;
  uVar37 = uVar43;
  if (puVar52 <= puVar29) {
    if (pBVar9 + ((long)puVar25 - (long)pBVar9 & 0xffffffffU) + 2 <= src) goto LAB_0016ec4b;
    pUVar12[(uint)(*(int *)(pBVar9 + ((long)puVar25 - (long)pBVar9 & 0xffffffffU) + 2) * -0x61c8864f
                  ) >> (bVar21 & 0x1f)] = UVar46 + 2;
    pUVar12[(uint)(*(int *)((long)puVar52 + -2) * -0x61c8864f) >> (bVar21 & 0x1f)] =
         ((int)puVar52 + -2) - iVar41;
    do {
      uVar42 = uVar43;
      UVar46 = (int)puVar52 - iVar41;
      uVar43 = UVar46 - local_130;
      pBVar19 = pBVar9;
      if (uVar43 < uVar4) {
        pBVar19 = pBVar10 + -(ulong)uVar26;
      }
      uVar37 = uVar42;
      if (((uVar4 - 1) - uVar43 < 3) || (*(int *)(pBVar19 + uVar43) != (int)*puVar52)) break;
      puVar48 = iEnd;
      if (uVar43 < uVar4) {
        puVar48 = mEnd;
      }
      sVar18 = ZSTD_count_2segments
                         ((BYTE *)((long)puVar52 + 4),(BYTE *)((long)(pBVar19 + uVar43) + 4),
                          (BYTE *)iEnd,(BYTE *)puVar48,iStart);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar45 - (long)seqStore->sequencesStart >> 3))
      goto LAB_0016ead7;
      if (0x20000 < seqStore->maxNbLit) goto LAB_0016eaf6;
      puVar48 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar48) goto LAB_0016eb53;
      if (iEnd < puVar52) goto LAB_0016eb34;
      if (puVar1 < puVar52) {
        ZSTD_safecopyLiterals((BYTE *)puVar48,(BYTE *)puVar52,(BYTE *)puVar52,(BYTE *)puVar1);
      }
      else {
        uVar34 = puVar52[1];
        *puVar48 = *puVar52;
        puVar48[1] = uVar34;
      }
      psVar45 = seqStore->sequences;
      psVar45->litLength = 0;
      psVar45->offBase = 1;
      if (sVar18 + 4 < 3) goto LAB_0016eb15;
      if (0xffff < sVar18 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0016eb72;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar45 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar45->mlBase = (U16)(sVar18 + 1);
      psVar45 = psVar45 + 1;
      seqStore->sequences = psVar45;
      pUVar12[(uint)((int)*puVar52 * -0x61c8864f) >> (bVar21 & 0x1f)] = UVar46;
      puVar52 = (ulong *)((long)puVar52 + sVar18 + 4);
      uVar37 = local_130;
      uVar43 = local_130;
      local_130 = uVar42;
    } while (puVar52 <= puVar29);
  }
  puVar48 = (ulong *)((long)puVar52 + uVar47);
  puVar25 = puVar52;
  if (puVar29 < puVar48) goto LAB_0016eab3;
  goto LAB_0016e117;
  while (bVar13 = pBVar50 < pBVar19, pBVar19 = pBVar19 + -1, bVar13) {
LAB_0016c33a:
    puVar23 = (ulong *)((long)puVar48 + -1);
    if ((*(BYTE *)puVar23 != *pBVar19) ||
       (uVar34 = uVar34 + 1, puVar48 = puVar23, puVar23 <= puVar52)) break;
  }
LAB_0016c5f3:
  uVar43 = UVar46 - (uVar42 + uVar26);
  if (uVar43 == 0) {
LAB_0016ecc7:
    __assert_fail("(offset)>0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x71ed,
                  "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                 );
  }
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_0016ead7;
  if (0x20000 < seqStore->maxNbLit) goto LAB_0016eaf6;
  uVar22 = (long)puVar48 - (long)puVar52;
  puVar23 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar23 + uVar22)) goto LAB_0016eb53;
  if (iEnd < puVar48) goto LAB_0016eb34;
  if (puVar1 < puVar48) {
    ZSTD_safecopyLiterals((BYTE *)puVar23,(BYTE *)puVar52,(BYTE *)puVar48,(BYTE *)puVar1);
LAB_0016c672:
    seqStore->lit = seqStore->lit + uVar22;
    if (0xffff < uVar22) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0016ec89;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar40 = puVar52[1];
    *puVar23 = *puVar52;
    puVar23[1] = uVar40;
    pBVar19 = seqStore->lit;
    if (0x10 < uVar22) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar19 + 0x10) + (-0x10 - (long)(puVar52 + 2))))
      goto LAB_0016eca8;
      uVar40 = puVar52[3];
      *(ulong *)(pBVar19 + 0x10) = puVar52[2];
      *(ulong *)(pBVar19 + 0x18) = uVar40;
      if (0x20 < (long)uVar22) {
        lVar32 = 0;
        do {
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x20);
          uVar14 = puVar3[1];
          pBVar2 = pBVar19 + lVar32 + 0x20;
          *(undefined8 *)pBVar2 = *puVar3;
          *(undefined8 *)(pBVar2 + 8) = uVar14;
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x30);
          uVar14 = puVar3[1];
          *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
          *(undefined8 *)(pBVar2 + 0x18) = uVar14;
          lVar32 = lVar32 + 0x20;
        } while (pBVar2 + 0x20 < pBVar19 + uVar22);
      }
      goto LAB_0016c672;
    }
    seqStore->lit = pBVar19 + uVar22;
  }
  psVar45 = seqStore->sequences;
  psVar45->litLength = (U16)uVar22;
  psVar45->offBase = uVar43 + 3;
  if (uVar34 < 3) goto LAB_0016eb15;
  uVar22 = uVar34 - 3;
  local_130 = uVar37;
  if (uVar22 < 0x10000) goto LAB_0016c782;
  ZVar7 = seqStore->longLengthType;
  goto joined_r0x0016c763;
LAB_0016c1f5:
  puVar23 = (ulong *)((long)puVar25 + 4);
  puVar24 = (ulong *)(piVar31 + 1);
  puVar51 = puVar23;
  if (puVar23 < (ulong *)((long)iEnd - 7U)) {
    if (*puVar24 == *puVar23) {
      lVar32 = 0;
      do {
        puVar24 = (ulong *)((long)puVar25 + lVar32 + 0xc);
        if ((ulong *)((long)iEnd - 7U) <= puVar24) {
          puVar24 = (ulong *)(pBVar9 + lVar32 + uVar17 + 0xc);
          puVar51 = (ulong *)((long)puVar25 + lVar32 + 0xc);
          goto LAB_0016c3d9;
        }
        lVar16 = lVar32 + uVar17 + 0xc;
        uVar34 = *puVar24;
        lVar32 = lVar32 + 8;
      } while (*(ulong *)(pBVar9 + lVar16) == uVar34);
      uVar34 = uVar34 ^ *(ulong *)(pBVar9 + lVar16);
      uVar22 = 0;
      if (uVar34 != 0) {
        for (; (uVar34 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
        }
      }
      uVar34 = (uVar22 >> 3 & 0x1fffffff) + lVar32;
    }
    else {
      uVar22 = *puVar23 ^ *puVar24;
      uVar34 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
        }
      }
      uVar34 = uVar34 >> 3 & 0x1fffffff;
    }
  }
  else {
LAB_0016c3d9:
    if ((puVar51 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar24 == (int)*puVar51)) {
      puVar51 = (ulong *)((long)puVar51 + 4);
      puVar24 = (ulong *)((long)puVar24 + 4);
    }
    if ((puVar51 < (ulong *)((long)iEnd + -1)) && ((short)*puVar24 == (short)*puVar51)) {
      puVar51 = (ulong *)((long)puVar51 + 2);
      puVar24 = (ulong *)((long)puVar24 + 2);
    }
    if (puVar51 < iEnd) {
      puVar51 = (ulong *)((long)puVar51 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar51));
    }
    uVar34 = (long)puVar51 - (long)puVar23;
  }
  uVar34 = uVar34 + 4;
  if (puVar52 < puVar25) {
    pBVar19 = pBVar9 + (uVar17 - 1);
    do {
      puVar23 = (ulong *)((long)puVar48 + -1);
      if ((*(BYTE *)puVar23 != *pBVar19) ||
         (uVar34 = uVar34 + 1, puVar48 = puVar23, puVar23 <= puVar52)) break;
      bVar13 = iStart < pBVar19;
      pBVar19 = pBVar19 + -1;
    } while (bVar13);
  }
  uVar43 = (int)puVar25 - (int)piVar31;
  if (uVar43 == 0) {
LAB_0016ec6a:
    __assert_fail("(offset)>0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x71ff,
                  "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                 );
  }
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) {
LAB_0016ead7:
    __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x468b,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (0x20000 < seqStore->maxNbLit) {
LAB_0016eaf6:
    __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x468d,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  uVar22 = (long)puVar48 - (long)puVar52;
  puVar23 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar23 + uVar22)) {
LAB_0016eb53:
    __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x468e,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (iEnd < puVar48) {
LAB_0016eb34:
    __assert_fail("literals + litLength <= litLimit",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x468f,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (puVar1 < puVar48) {
    ZSTD_safecopyLiterals((BYTE *)puVar23,(BYTE *)puVar52,(BYTE *)puVar48,(BYTE *)puVar1);
LAB_0016c4f2:
    seqStore->lit = seqStore->lit + uVar22;
    if (0xffff < uVar22) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0016ec89;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar40 = puVar52[1];
    *puVar23 = *puVar52;
    puVar23[1] = uVar40;
    pBVar19 = seqStore->lit;
    if (0x10 < uVar22) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar19 + 0x10) + (-0x10 - (long)(puVar52 + 2)))) {
LAB_0016eca8:
        __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x36a6,
                      "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
      }
      uVar40 = puVar52[3];
      *(ulong *)(pBVar19 + 0x10) = puVar52[2];
      *(ulong *)(pBVar19 + 0x18) = uVar40;
      if (0x20 < (long)uVar22) {
        lVar32 = 0;
        do {
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x20);
          uVar14 = puVar3[1];
          pBVar2 = pBVar19 + lVar32 + 0x20;
          *(undefined8 *)pBVar2 = *puVar3;
          *(undefined8 *)(pBVar2 + 8) = uVar14;
          puVar3 = (undefined8 *)((long)puVar52 + lVar32 + 0x30);
          uVar14 = puVar3[1];
          *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
          *(undefined8 *)(pBVar2 + 0x18) = uVar14;
          lVar32 = lVar32 + 0x20;
        } while (pBVar2 + 0x20 < pBVar19 + uVar22);
      }
      goto LAB_0016c4f2;
    }
    seqStore->lit = pBVar19 + uVar22;
  }
  psVar45 = seqStore->sequences;
  psVar45->litLength = (U16)uVar22;
  psVar45->offBase = uVar43 + 3;
  if (uVar34 < 3) goto LAB_0016eb15;
  uVar22 = uVar34 - 3;
  local_130 = uVar37;
  if (uVar22 < 0x10000) goto LAB_0016c782;
  ZVar7 = seqStore->longLengthType;
joined_r0x0016c763:
  local_130 = uVar37;
  if (ZVar7 != ZSTD_llt_none) goto LAB_0016eb72;
LAB_0016c769:
  seqStore->longLengthType = ZSTD_llt_matchLength;
  seqStore->longLengthPos = (U32)((ulong)((long)psVar45 - (long)seqStore->sequencesStart) >> 3);
LAB_0016c782:
  puVar52 = (ulong *)(uVar34 + (long)puVar48);
  psVar45->mlBase = (U16)uVar22;
  psVar45 = psVar45 + 1;
  seqStore->sequences = psVar45;
  uVar37 = uVar43;
  if (puVar52 <= puVar29) {
    if (pBVar9 + ((long)puVar25 - (long)pBVar9 & 0xffffffffU) + 2 <= src) {
LAB_0016ec4b:
      __assert_fail("base+curr+2 > istart",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x721b,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                   );
    }
    pUVar12[(ulong)(*(long *)(pBVar9 + ((long)puVar25 - (long)pBVar9 & 0xffffffffU) + 2) *
                   -0x30e44323405a9d00) >> (bVar21 & 0x3f)] = UVar46 + 2;
    pUVar12[(ulong)(*(long *)((long)puVar52 + -2) * -0x30e44323405a9d00) >> (bVar21 & 0x3f)] =
         ((int)puVar52 + -2) - iVar41;
    do {
      uVar42 = uVar43;
      UVar46 = (int)puVar52 - iVar41;
      uVar43 = UVar46 - local_130;
      pBVar19 = pBVar9;
      if (uVar43 < uVar4) {
        pBVar19 = pBVar10 + -(ulong)uVar26;
      }
      uVar37 = uVar42;
      if (((uVar4 - 1) - uVar43 < 3) || (*(int *)(pBVar19 + uVar43) != (int)*puVar52)) break;
      puVar48 = iEnd;
      if (uVar43 < uVar4) {
        puVar48 = mEnd;
      }
      sVar18 = ZSTD_count_2segments
                         ((BYTE *)((long)puVar52 + 4),(BYTE *)((long)(pBVar19 + uVar43) + 4),
                          (BYTE *)iEnd,(BYTE *)puVar48,iStart);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar45 - (long)seqStore->sequencesStart >> 3))
      goto LAB_0016ead7;
      if (0x20000 < seqStore->maxNbLit) goto LAB_0016eaf6;
      puVar48 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar48) goto LAB_0016eb53;
      if (iEnd < puVar52) goto LAB_0016eb34;
      if (puVar1 < puVar52) {
        ZSTD_safecopyLiterals((BYTE *)puVar48,(BYTE *)puVar52,(BYTE *)puVar52,(BYTE *)puVar1);
      }
      else {
        uVar34 = puVar52[1];
        *puVar48 = *puVar52;
        puVar48[1] = uVar34;
      }
      psVar45 = seqStore->sequences;
      psVar45->litLength = 0;
      psVar45->offBase = 1;
      if (sVar18 + 4 < 3) goto LAB_0016eb15;
      if (0xffff < sVar18 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0016eb72;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar45 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar45->mlBase = (U16)(sVar18 + 1);
      psVar45 = psVar45 + 1;
      seqStore->sequences = psVar45;
      pUVar12[*puVar52 * -0x30e44323405a9d00 >> (bVar21 & 0x3f)] = UVar46;
      puVar52 = (ulong *)((long)puVar52 + sVar18 + 4);
      uVar43 = local_130;
      uVar37 = local_130;
      local_130 = uVar42;
    } while (puVar52 <= puVar29);
  }
  puVar48 = (ulong *)((long)puVar52 + uVar47);
  puVar25 = puVar52;
  if (puVar29 < puVar48) goto LAB_0016eab3;
  goto LAB_0016bfd7;
}

Assistant:

size_t ZSTD_compressBlock_fast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState != NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_dictMatchState_4_0(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_fast_dictMatchState_5_0(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_fast_dictMatchState_6_0(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_fast_dictMatchState_7_0(ms, seqStore, rep, src, srcSize);
    }
}